

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_counted_ptr.h
# Opt level: O0

RefCountedPtr<raptor::Status> __thiscall
raptor::MakeRefCounted<raptor::Status,char*&>(raptor *this,char **args)

{
  char *pcVar1;
  Status *this_00;
  allocator local_39;
  string local_38 [32];
  char **local_18;
  char **args_local;
  
  local_18 = args;
  args_local = (char **)this;
  this_00 = (Status *)operator_new(0x30);
  pcVar1 = *local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  Status::Status(this_00,(string *)local_38);
  RefCountedPtr<raptor::Status>::RefCountedPtr<raptor::Status>
            ((RefCountedPtr<raptor::Status> *)this,this_00);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

inline RefCountedPtr<T> MakeRefCounted(Args&&... args) {
    return RefCountedPtr<T>(new T(std::forward<Args>(args)...));
}